

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.hpp
# Opt level: O1

ThreadCache * tcmalloc::ThreadCache::Current(void)

{
  int iVar1;
  ThreadCache *this;
  long in_FS_OFFSET;
  
  if (*(ThreadCache **)(in_FS_OFFSET + -8) != (ThreadCache *)0x0) {
    return *(ThreadCache **)(in_FS_OFFSET + -8);
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)global_lock);
  if (iVar1 == 0) {
    if (global_inited == '\0') {
      GlobalInit();
    }
    if (global_inited == '\0') goto LAB_001092a6;
    this = FixedAllocator<tcmalloc::ThreadCache>::Alloc
                     ((FixedAllocator<tcmalloc::ThreadCache> *)thread_cache_allocator);
    Init(this);
    *(ThreadCache **)(in_FS_OFFSET + -8) = this;
    pthread_mutex_unlock((pthread_mutex_t *)global_lock);
    pthread_setspecific(spec_key,this);
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)global_lock);
    if (iVar1 == 0) {
      this->prev = (ThreadCache *)cache_list;
      this->next = (ThreadCache *)cache_list._4152_8_;
      *(ThreadCache **)(cache_list._4152_8_ + 0x1030) = this;
      cache_list_size = cache_list_size + 1;
      cache_list._4152_8_ = this;
      pthread_mutex_unlock((pthread_mutex_t *)global_lock);
      return *(ThreadCache **)(in_FS_OFFSET + -8);
    }
  }
  std::__throw_system_error(iVar1);
LAB_001092a6:
  __assert_fail("global_inited",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/thread_cache.hpp"
                ,0xf0,"static ThreadCache *tcmalloc::ThreadCache::Current()");
}

Assistant:

static ThreadCache* Current() {
        if (tls_cache != nullptr) return tls_cache;

        global_lock.lock();
        if (!global_inited) {
            ThreadCache::GlobalInit();
        }
        assert(global_inited);
        ThreadCache* cache = thread_cache_allocator.Alloc();
        cache->Init();
        // pthread_setspecific可能调用malloc递归回这个函数
        // 先设置tls_cache递归基，再调用pthread_setspecific
        tls_cache = cache;
        global_lock.unlock();
        pthread_setspecific(spec_key, cache);

        global_lock.lock();
        CacheListInsert(&cache_list, cache);
        global_lock.unlock();
        return tls_cache;
    }